

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O0

int EVP_PKEY_cmp_parameters(EVP_PKEY *a,EVP_PKEY *b)

{
  EVP_PKEY *b_local;
  EVP_PKEY *a_local;
  
  if (a->save_type == b->save_type) {
    if ((a->ameth == (EVP_PKEY_ASN1_METHOD *)0x0) || (*(long *)(a->ameth + 0x98) == 0)) {
      a_local._4_4_ = -2;
    }
    else {
      a_local._4_4_ = (**(code **)(a->ameth + 0x98))(a,b);
    }
  }
  else {
    a_local._4_4_ = -1;
  }
  return a_local._4_4_;
}

Assistant:

int EVP_PKEY_cmp_parameters(const EVP_PKEY *a, const EVP_PKEY *b) {
  if (a->type != b->type) {
    return -1;
  }
  if (a->ameth && a->ameth->param_cmp) {
    return a->ameth->param_cmp(a, b);
  }
  // TODO(https://crbug.com/boringssl/536): If the algorithm doesn't use
  // parameters, they should compare as vacuously equal.
  return -2;
}